

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

RequestBuilder * __thiscall
restincurl::RequestBuilder::SendFileAsMimeData
          (RequestBuilder *this,string *path,string *name,string *remoteName,string *mimeType)

{
  _Head_base<0UL,_restincurl::Request_*,_false> this_00;
  
  this_00._M_head_impl =
       (this->request_)._M_t.
       super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>._M_t.
       super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>.
       super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl;
  if (this_00._M_head_impl == (Request *)0x0) {
    __assert_fail("request_",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                  ,0x55e,
                  "RequestBuilder &restincurl::RequestBuilder::SendFileAsMimeData(const std::string &, const std::string &, const std::string &, const std::string &)"
                 );
  }
  if (this->request_type_ == POST_MIME) {
    Request::AddFileAsMimeData(this_00._M_head_impl,path,name,remoteName,mimeType);
    return this;
  }
  __assert_fail("request_type_ == RequestType::POST_MIME",
                "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                ,0x55f,
                "RequestBuilder &restincurl::RequestBuilder::SendFileAsMimeData(const std::string &, const std::string &, const std::string &, const std::string &)"
               );
}

Assistant:

RequestBuilder& SendFileAsMimeData(const std::string& path,
                               const std::string& name = {},
                               const std::string& remoteName = {},
                               const std::string& mimeType = {}) {
            assert(request_);
            assert(request_type_ == RequestType::POST_MIME);
            if (request_type_ != RequestType::POST_MIME) {
                throw Exception{"Must use PostMime operation to add mime attachments"};
            }
            request_->AddFileAsMimeData(path, name, remoteName, mimeType);
            return *this;
        }